

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool __thiscall google::protobuf::compiler::CanSkipEditionCheck(compiler *this,string_view filename)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  piVar2 = (int *)filename._M_len;
  if (this < (compiler *)0x10) {
    if (this < (compiler *)0x4) {
      return false;
    }
  }
  else {
    auVar3[0] = -((char)*piVar2 == 'g');
    auVar3[1] = -(*(char *)((long)piVar2 + 1) == 'o');
    auVar3[2] = -(*(char *)((long)piVar2 + 2) == 'o');
    auVar3[3] = -(*(char *)((long)piVar2 + 3) == 'g');
    auVar3[4] = -((char)piVar2[1] == 'l');
    auVar3[5] = -(*(char *)((long)piVar2 + 5) == 'e');
    auVar3[6] = -(*(char *)((long)piVar2 + 6) == '/');
    auVar3[7] = -(*(char *)((long)piVar2 + 7) == 'p');
    auVar3[8] = -((char)piVar2[2] == 'r');
    auVar3[9] = -(*(char *)((long)piVar2 + 9) == 'o');
    auVar3[10] = -(*(char *)((long)piVar2 + 10) == 't');
    auVar3[0xb] = -(*(char *)((long)piVar2 + 0xb) == 'o');
    auVar3[0xc] = -((char)piVar2[3] == 'b');
    auVar3[0xd] = -(*(char *)((long)piVar2 + 0xd) == 'u');
    auVar3[0xe] = -(*(char *)((long)piVar2 + 0xe) == 'f');
    auVar3[0xf] = -(*(char *)((long)piVar2 + 0xf) == '/');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        == 0xffff) {
      return true;
    }
  }
  if (*piVar2 != 0x2f627075) {
    if (this <= (compiler *)&DAT_00000013) {
      return false;
    }
    iVar1 = piVar2[4];
    auVar5[0] = -((char)iVar1 == 'b');
    auVar5[1] = -((char)((uint)iVar1 >> 8) == 'u');
    auVar5[2] = -((char)((uint)iVar1 >> 0x10) == 'f');
    auVar5[3] = -((char)((uint)iVar1 >> 0x18) == '/');
    auVar5[4] = 0xff;
    auVar5[5] = 0xff;
    auVar5[6] = 0xff;
    auVar5[7] = 0xff;
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar4[0] = -((char)*piVar2 == 'c');
    auVar4[1] = -(*(char *)((long)piVar2 + 1) == 'o');
    auVar4[2] = -(*(char *)((long)piVar2 + 2) == 'm');
    auVar4[3] = -(*(char *)((long)piVar2 + 3) == '/');
    auVar4[4] = -((char)piVar2[1] == 'g');
    auVar4[5] = -(*(char *)((long)piVar2 + 5) == 'o');
    auVar4[6] = -(*(char *)((long)piVar2 + 6) == 'o');
    auVar4[7] = -(*(char *)((long)piVar2 + 7) == 'g');
    auVar4[8] = -((char)piVar2[2] == 'l');
    auVar4[9] = -(*(char *)((long)piVar2 + 9) == 'e');
    auVar4[10] = -(*(char *)((long)piVar2 + 10) == '/');
    auVar4[0xb] = -(*(char *)((long)piVar2 + 0xb) == 'p');
    auVar4[0xc] = -((char)piVar2[3] == 'r');
    auVar4[0xd] = -(*(char *)((long)piVar2 + 0xd) == 'o');
    auVar4[0xe] = -(*(char *)((long)piVar2 + 0xe) == 't');
    auVar4[0xf] = -(*(char *)((long)piVar2 + 0xf) == 'o');
    auVar4 = auVar4 & auVar5;
    return (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
  }
  return true;
}

Assistant:

inline constexpr bool StartsWith(absl::string_view text,
                                 absl::string_view prefix) noexcept {
  if (prefix.empty()) {
    return true;
  }
  if (text.size() < prefix.size()) {
    return false;
  }
  absl::string_view possible_match = text.substr(0, prefix.size());

  return possible_match == prefix;
}